

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 12_string_object.cpp
# Opt level: O3

int input_and_output_lines(void)

{
  undefined1 *puVar1;
  char cVar2;
  long lVar3;
  ostream *poVar4;
  undefined8 extraout_RAX;
  string *psVar5;
  string list [5];
  undefined8 auStack_e8 [2];
  string local_d8 [4];
  undefined8 auStack_58 [2];
  char local_48 [24];
  
  lVar3 = 0x10;
  do {
    puVar1 = (undefined1 *)((long)&local_d8[0]._M_dataplus._M_p + lVar3);
    *(undefined1 **)((long)auStack_e8 + lVar3) = puVar1;
    *(undefined8 *)((long)local_d8 + lVar3 + -8) = 0;
    *puVar1 = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xb0);
  auStack_e8[1] = 0x10afaf;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter your ",0xb);
  auStack_e8[1] = 0x10afc0;
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,5);
  auStack_e8[1] = 0x10afd4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," favorite fruit name: \n",0x17);
  psVar5 = local_d8;
  for (lVar3 = -5; lVar3 != 0; lVar3 = lVar3 + 1) {
    auStack_e8[1] = 0x10b004;
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar3 + 6);
    auStack_e8[1] = 0x10b014;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," :",2);
    auStack_e8[1] = 0x10b028;
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '(');
    auStack_e8[1] = 0x10b03e;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)psVar5,cVar2);
    psVar5 = (string *)((long)psVar5 + 0x20);
  }
  auStack_e8[1] = 0x10b05b;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Here\'s what you input:\n",0x17);
  auStack_e8[1] = 0x10b068;
  display_all_strings(local_d8,5);
  lVar3 = 0;
  do {
    if (local_48 + lVar3 != *(char **)((long)auStack_58 + lVar3)) {
      auStack_e8[1] = 0x10b08e;
      operator_delete(*(char **)((long)auStack_58 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0xa0);
  auStack_e8[1] = 0x10b0a3;
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int input_and_output_lines () {
    using namespace std;
    string list[SIZE];
    cout << "Enter your " << SIZE << " favorite fruit name: \n";
    for (int i = 0; i < SIZE; i++) {
        cout << i + 1 << " :";
        //  从输入流 CIN 中取一行，写入字符串地址
        getline(cin, list[i]);
    }
    cout << "Here's what you input:\n";
    display_all_strings(list, SIZE);
}